

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ReceivedServerConnect(Curl_easy *data,_Bool *received)

{
  int local_5c;
  int ftpcode;
  ssize_t nread;
  timediff_t timeout_ms;
  anon_union_248_5_a113b5f6_for_proto *paStack_40;
  int result;
  pingpong *pp;
  ftp_conn *ftpc;
  curl_socket_t data_sock;
  curl_socket_t ctrl_sock;
  connectdata *conn;
  _Bool *received_local;
  Curl_easy *data_local;
  
  _data_sock = data->conn;
  ftpc._4_4_ = _data_sock->sock[0];
  ftpc._0_4_ = _data_sock->sock[1];
  paStack_40 = &_data_sock->proto;
  *received = false;
  pp = (pingpong *)paStack_40;
  conn = (connectdata *)received;
  received_local = (_Bool *)data;
  nread = ftp_timeleft_accept(data);
  Curl_infof((Curl_easy *)received_local,"Checking for server connect");
  if (nread < 0) {
    Curl_failf((Curl_easy *)received_local,"Accept timeout occurred while waiting server connect");
    data_local._4_4_ = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else if ((((paStack_40->ftpc).pp.cache_size == 0) || ((paStack_40->ftpc).pp.cache == (char *)0x0))
          || (*(paStack_40->ftpc).pp.cache < '4')) {
    timeout_ms._4_4_ = Curl_socket_check(ftpc._4_4_,(curl_socket_t)ftpc,-1,0);
    if (timeout_ms._4_4_ == 0xffffffff) {
      Curl_failf((Curl_easy *)received_local,"Error while waiting for server connect");
      data_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
    }
    else {
      if (timeout_ms._4_4_ != 0) {
        if ((timeout_ms._4_4_ & 8) == 0) {
          if ((timeout_ms._4_4_ & 1) != 0) {
            Curl_infof((Curl_easy *)received_local,"Ctrl conn has data while waiting for data conn")
            ;
            Curl_GetFTPResponse((Curl_easy *)received_local,(ssize_t *)&stack0xffffffffffffffa8,
                                &local_5c);
            if (3 < local_5c / 100) {
              return CURLE_FTP_ACCEPT_FAILED;
            }
            return CURLE_WEIRD_SERVER_REPLY;
          }
        }
        else {
          Curl_infof((Curl_easy *)received_local,"Ready to accept data connection from server");
          *(undefined1 *)&(conn->cnnct).state = CONNECT_SOCKS_INIT;
        }
      }
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    Curl_infof((Curl_easy *)received_local,"There is negative response in cache while serv connect")
    ;
    Curl_GetFTPResponse((Curl_easy *)received_local,(ssize_t *)&stack0xffffffffffffffa8,&local_5c);
    data_local._4_4_ = CURLE_FTP_ACCEPT_FAILED;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ReceivedServerConnect(struct Curl_easy *data, bool *received)
{
  struct connectdata *conn = data->conn;
  curl_socket_t ctrl_sock = conn->sock[FIRSTSOCKET];
  curl_socket_t data_sock = conn->sock[SECONDARYSOCKET];
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  int result;
  timediff_t timeout_ms;
  ssize_t nread;
  int ftpcode;

  *received = FALSE;

  timeout_ms = ftp_timeleft_accept(data);
  infof(data, "Checking for server connect");
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* First check whether there is a cached response from server */
  if(pp->cache_size && pp->cache && pp->cache[0] > '3') {
    /* Data connection could not be established, let's return */
    infof(data, "There is negative response in cache while serv connect");
    (void)Curl_GetFTPResponse(data, &nread, &ftpcode);
    return CURLE_FTP_ACCEPT_FAILED;
  }

  result = Curl_socket_check(ctrl_sock, data_sock, CURL_SOCKET_BAD, 0);

  /* see if the connection request is already here */
  switch(result) {
  case -1: /* error */
    /* let's die here */
    failf(data, "Error while waiting for server connect");
    return CURLE_FTP_ACCEPT_FAILED;
  case 0:  /* Server connect is not received yet */
    break; /* loop */
  default:

    if(result & CURL_CSELECT_IN2) {
      infof(data, "Ready to accept data connection from server");
      *received = TRUE;
    }
    else if(result & CURL_CSELECT_IN) {
      infof(data, "Ctrl conn has data while waiting for data conn");
      (void)Curl_GetFTPResponse(data, &nread, &ftpcode);

      if(ftpcode/100 > 3)
        return CURLE_FTP_ACCEPT_FAILED;

      return CURLE_WEIRD_SERVER_REPLY;
    }

    break;
  } /* switch() */

  return CURLE_OK;
}